

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptPromiseResolveThenableTaskFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseResolveThenableTaskFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,JavascriptPromise *promise,
          RecyclableObject *thenable,RecyclableObject *thenFunction)

{
  Recycler *pRVar1;
  FunctionInfo *this_00;
  JavascriptPromiseResolveThenableTaskFunction *this_01;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_a1;
  TrackAllocData local_a0;
  DynamicType *local_78;
  DynamicType *type;
  undefined8 local_68;
  TrackAllocData local_60;
  FunctionInfo *local_38;
  FunctionInfo *functionInfo;
  RecyclableObject *thenFunction_local;
  RecyclableObject *thenable_local;
  JavascriptPromise *promise_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  functionInfo = (FunctionInfo *)thenFunction;
  thenFunction_local = thenable;
  thenable_local = (RecyclableObject *)promise;
  promise_local = (JavascriptPromise *)entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  pRVar1 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&FunctionInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x19f3);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_60);
  type = (DynamicType *)Memory::Recycler::AllocInlined;
  local_68 = 0;
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x43c4b0);
  FunctionInfo::FunctionInfo
            (this_00,(JavascriptMethod)promise_local,ErrorOnNew,0xffffffff,(FunctionProxy *)0x0);
  local_38 = this_00;
  local_78 = CreateDeferredPrototypeFunctionType(this,(JavascriptMethod)promise_local);
  pRVar1 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_a0,(type_info *)&JavascriptPromiseResolveThenableTaskFunction::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x19f6);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_a0);
  this_01 = (JavascriptPromiseResolveThenableTaskFunction *)
            new<(Memory::ObjectInfoBits)1>(0x58,pRVar1,&local_a1);
  JavascriptPromiseResolveThenableTaskFunction::JavascriptPromiseResolveThenableTaskFunction
            (this_01,local_78,local_38,(JavascriptPromise *)thenable_local,thenFunction_local,
             (RecyclableObject *)functionInfo);
  return this_01;
}

Assistant:

JavascriptPromiseResolveThenableTaskFunction* JavascriptLibrary::CreatePromiseResolveThenableTaskFunction(JavascriptMethod entryPoint, JavascriptPromise* promise, RecyclableObject* thenable, RecyclableObject* thenFunction)
    {
        FunctionInfo* functionInfo = RecyclerNew(this->GetRecycler(), FunctionInfo, entryPoint, FunctionInfo::Attributes::ErrorOnNew);
        DynamicType* type = CreateDeferredPrototypeFunctionType(entryPoint);

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseResolveThenableTaskFunction, type, functionInfo, promise, thenable, thenFunction);
    }